

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.h
# Opt level: O2

TSStateId ts_language_next_state(TSLanguage *self,TSStateId state,TSSymbol symbol)

{
  TSStateId TVar1;
  TSParseAction *pTVar2;
  uint uVar3;
  undefined6 in_register_00000012;
  uint32_t count;
  uint32_t local_c;
  
  if (0xfffd < symbol) {
    return 0;
  }
  uVar3 = (uint)CONCAT62(in_register_00000012,symbol);
  if (self->token_count <= uVar3) {
    return self->parse_table[(uint)state * self->symbol_count + uVar3];
  }
  pTVar2 = ts_language_actions(self,state,symbol,&local_c);
  if (local_c != 0) {
    TVar1 = pTVar2[local_c - 1].params.field_0.state;
    if ((pTVar2[local_c - 1].field_0x6 & 0xf) == 0) {
      return TVar1;
    }
    if ((pTVar2[local_c - 1].field_0x6 & 0xf) == 3) {
      return TVar1;
    }
  }
  return 0;
}

Assistant:

static inline TSStateId ts_language_next_state(const TSLanguage *self,
                                               TSStateId state,
                                               TSSymbol symbol) {
  if (symbol == ts_builtin_sym_error || symbol == ts_builtin_sym_error_repeat) {
    return 0;
  } else if (symbol < self->token_count) {
    uint32_t count;
    const TSParseAction *actions = ts_language_actions(self, state, symbol, &count);
    if (count > 0) {
      TSParseAction action = actions[count - 1];
      if (action.type == TSParseActionTypeShift || action.type == TSParseActionTypeRecover) {
        return action.params.state;
      }
    }
    return 0;
  } else {
    return self->parse_table[state * self->symbol_count + symbol];
  }
}